

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::cancelVote(Server *this,TeamType team)

{
  ssize_t sVar1;
  size_t in_RCX;
  int in_R8D;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  char *local_48;
  char *local_38;
  char *local_28;
  TeamType team_local;
  Server *this_local;
  
  if (team == GDI) {
    bVar2 = sv("cancelvote 0",0xc);
    local_38 = bVar2._M_str;
    sVar1 = send(this,(int)bVar2._M_len,local_38,in_RCX,in_R8D);
    this_local._7_1_ = 0 < (int)sVar1;
  }
  else if (team == Nod) {
    bVar2 = sv("cancelvote 1",0xc);
    local_48 = bVar2._M_str;
    sVar1 = send(this,(int)bVar2._M_len,local_48,in_RCX,in_R8D);
    this_local._7_1_ = 0 < (int)sVar1;
  }
  else {
    bVar2 = sv("cancelvote -1",0xd);
    local_28 = bVar2._M_str;
    sVar1 = send(this,(int)bVar2._M_len,local_28,in_RCX,in_R8D);
    this_local._7_1_ = 0 < (int)sVar1;
  }
  return this_local._7_1_;
}

Assistant:

bool RenX::Server::cancelVote(const RenX::TeamType team) {
	switch (team) {
	default:
		return send("cancelvote -1"sv) > 0;
	case TeamType::GDI:
		return send("cancelvote 0"sv) > 0;
	case TeamType::Nod:
		return send("cancelvote 1"sv) > 0;
	}
}